

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

TypedVector * __thiscall flexbuffers::Map::Keys(TypedVector *__return_storage_ptr__,Map *this)

{
  ulong *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  bVar4 = (this->super_Vector).super_Sized.super_Object.byte_width_;
  uVar3 = (ulong)bVar4;
  puVar1 = (ulong *)((this->super_Vector).super_Sized.super_Object.data_ + uVar3 * -3);
  if (uVar3 < 4) {
    if (bVar4 < 2) {
      uVar6 = (ulong)(byte)*puVar1;
      uVar5 = (uint)*(byte *)((long)puVar1 + uVar3);
    }
    else {
      uVar6 = (ulong)(ushort)*puVar1;
      uVar5 = (uint)*(ushort *)((long)puVar1 + uVar3);
    }
  }
  else if (bVar4 < 8) {
    uVar6 = (ulong)(uint)*puVar1;
    uVar5 = *(uint *)((long)puVar1 + uVar3);
  }
  else {
    uVar5 = (uint)*(byte *)((long)puVar1 + uVar3);
    uVar6 = *puVar1;
  }
  puVar2 = (uint8_t *)((long)puVar1 - uVar6);
  (__return_storage_ptr__->super_Sized).super_Object.data_ = puVar2;
  bVar4 = (byte)uVar5;
  (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = bVar4;
  lVar7 = -(ulong)(uVar5 & 0xff);
  if (bVar4 < 4) {
    if (bVar4 < 2) {
      uVar3 = (ulong)puVar2[lVar7];
    }
    else {
      uVar3 = (ulong)*(ushort *)(puVar2 + lVar7);
    }
  }
  else if (bVar4 < 8) {
    uVar3 = (ulong)*(uint *)(puVar2 + lVar7);
  }
  else {
    uVar3 = *(ulong *)(puVar2 + lVar7);
  }
  (__return_storage_ptr__->super_Sized).size_ = uVar3;
  __return_storage_ptr__->type_ = FBT_KEY;
  return __return_storage_ptr__;
}

Assistant:

TypedVector Keys() const {
    const size_t num_prefixed_fields = 3;
    auto keys_offset = data_ - byte_width_ * num_prefixed_fields;
    return TypedVector(Indirect(keys_offset, byte_width_),
                       static_cast<uint8_t>(
                           ReadUInt64(keys_offset + byte_width_, byte_width_)),
                       FBT_KEY);
  }